

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
llm_tokenizer_wpm_session::tokenize
          (llm_tokenizer_wpm_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  bool bVar1;
  long lVar2;
  int *piVar3;
  value_type_conflict3 *pvVar4;
  vector<int,_std::allocator<int>_> *in_RDX;
  undefined8 *in_RDI;
  llama_token id;
  int j;
  bool match;
  int i;
  size_t current_tokens;
  int n;
  string word1;
  string *word;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  value_type_conflict3 *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  llama_token in_stack_ffffffffffffff14;
  llama_vocab *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  int local_98;
  int local_94;
  byte local_8d;
  int local_8c;
  value_type_conflict3 *local_88;
  int local_80 [4];
  string local_70 [32];
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  undefined1 *local_38;
  undefined1 local_30 [8];
  string *in_stack_ffffffffffffffd8;
  
  preprocess(in_stack_ffffffffffffffd8);
  local_38 = local_30;
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffef8);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffef8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff00,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      return;
    }
    local_50 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_40);
    lVar2 = std::__cxx11::string::size();
    if (lVar2 != 0) {
      std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      local_80[0] = std::__cxx11::string::size();
      local_88 = (value_type_conflict3 *)std::vector<int,_std::allocator<int>_>::size(in_RDX);
      for (local_8c = 0; local_8c < local_80[0]; local_8c = local_8c + 1) {
        local_8d = 0;
        iVar5 = local_8c;
        local_98 = llama_vocab::max_token_len((llama_vocab *)0x541090);
        local_98 = iVar5 + 1 + local_98;
        piVar3 = std::min<int>(local_80,&local_98);
        for (local_94 = *piVar3; local_8c < local_94; local_94 = local_94 + -1) {
          in_stack_ffffffffffffff18 = (llama_vocab *)*in_RDI;
          std::__cxx11::string::substr((ulong)&stack0xffffffffffffff40,(ulong)local_70);
          in_stack_ffffffffffffff14 =
               llama_vocab::text_to_token
                         (in_stack_ffffffffffffff18,
                          (string *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
          if (in_stack_ffffffffffffff14 != -1) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08);
            local_8d = 1;
            local_8c = local_94 + -1;
            break;
          }
        }
        if ((local_8d & 1) == 0) {
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar5,in_stack_ffffffffffffff20),
                     (size_type)in_stack_ffffffffffffff18);
          break;
        }
      }
      in_stack_ffffffffffffff08 = local_88;
      pvVar4 = (value_type_conflict3 *)std::vector<int,_std::allocator<int>_>::size(in_RDX);
      if (in_stack_ffffffffffffff08 == pvVar4) {
        in_stack_ffffffffffffff00 = in_RDX;
        llama_vocab::token_unk((llama_vocab *)0x541233);
        llama_vocab::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
                   (value_type_conflict3 *)in_stack_fffffffffffffef8);
      }
      std::__cxx11::string::~string(local_70);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        // normalize and split by whitespace
        std::vector<std::string> words = preprocess(text);
        // bos token prepended already

        // find the longest tokens that form the words
        for (const std::string & word : words) {
            // skip empty words
            if (word.size() == 0) {
                continue;
            }

            // prepend phantom space
            const std::string word1 = "\xe2\x96\x81" + word;
            const int n = word1.size();

            const size_t current_tokens = output.size();

            // we're at the start of a new word
            // move through character position in word
            for (int i = 0; i < n; ++i) {
                // loop through possible match length
                bool match = false;
                for (int j = std::min(n, i + vocab.max_token_len() + 1); j > i; j--) {
                    auto id = vocab.text_to_token(word1.substr(i, j - i));
                    if (id != LLAMA_TOKEN_NULL) {
                        output.push_back(id);
                        match = true;
                        i = j - 1;
                        break;
                    }
                }

                if (!match) { // discard all
                    output.resize(current_tokens);
                    break;  // and discard next tokens
                }
            }

            // we didn't find any matches for this word
            if (current_tokens == output.size()) {
                output.push_back(vocab.token_unk());
            }
        }
    }